

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

StructSchema __thiscall capnp::Schema::asStruct(Schema *this)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_char> local_50;
  Reader local_40;
  
  getProto(&local_40,this);
  if (local_40._reader.dataSize < 0x70) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *(short *)((long)local_40._reader.data + 0xc) == 1;
    if (_kjCondition.value) {
      return (StructSchema)(Schema)this->raw;
    }
  }
  getProto(&local_40,this);
  local_50 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_40);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x11b,FAILED,"getProto().isStruct()",
             "_kjCondition,\"Tried to use non-struct schema as a struct.\", getProto().getDisplayName()"
             ,&_kjCondition,(char (*) [44])"Tried to use non-struct schema as a struct.",
             (Reader *)&local_50);
  kj::_::Debug::Fault::~Fault(&f);
  return (StructSchema)((long)_::NULL_STRUCT_SCHEMA + 0x48);
}

Assistant:

StructSchema Schema::asStruct() const {
  KJ_REQUIRE(getProto().isStruct(), "Tried to use non-struct schema as a struct.",
             getProto().getDisplayName()) {
    return StructSchema();
  }
  return StructSchema(*this);
}